

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePoint> *this,void **vtt,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapePoint> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  void *pvVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  ostream *poVar4;
  int64_t glIdx;
  char *local_1d0 [4];
  stringstream sout;
  ostream local_1a0 [376];
  
  TPZIntelGen<pzshape::TPZShapePoint>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePoint>,vtt + 1,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapePoint>,gl2lcConMap,gl2lcElMap);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapePoint>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fConnectIndexes).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x58) =
       vtt[9];
  _sout = 0xffffffffffffffff;
  TPZManVector<long,_1>::TPZManVector(&this->fConnectIndexes,1,(long *)&sout);
  this->fh1fam = copy->fh1fam;
  glIdx = *(copy->fConnectIndexes).super_TPZVec<long>.fStore;
  iVar2 = std::
          _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          ::find(&gl2lcConMap->_M_t,&glIdx);
  if ((_Rb_tree_header *)iVar2._M_node == &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&sout);
    poVar4 = std::operator<<(local_1a0,"ERROR in : ");
    poVar4 = std::operator<<(poVar4,
                             "TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1(TPZCompMesh &, const TPZCompElH1<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapePoint]"
                            );
    poVar4 = std::operator<<(poVar4," trying to clone the connect index: ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4," wich is not in mapped connect indexes!");
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&std::cout,local_1d0[0]);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)local_1d0);
    *(this->fConnectIndexes).super_TPZVec<long>.fStore = -1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&sout);
  }
  else {
    pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcConMap,&glIdx);
    *(this->fConnectIndexes).super_TPZVec<long>.fStore = *pmVar3;
  }
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh,
								 const TPZCompElH1<TSHAPE> &copy,
								 std::map<int64_t,int64_t> & gl2lcConMap,
								 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElH1::ClassId), 
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fh1fam(copy.fh1fam)
{
	int i;
	for(i=0;i<TSHAPE::NSides;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			fConnectIndexes[i] = -1;
			return;
		}
		fConnectIndexes[i] = lcIdx;
	}
  //TODO:NATHANFRAN
}